

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseJsonName
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  allocator local_41;
  LocationRecorder location;
  
  if (((field->_has_bits_).has_bits_[0] & 0x10) != 0) {
    std::__cxx11::string::string((string *)&location,"Already set option \"json_name\".",&local_41);
    AddError(this,(string *)&location);
    std::__cxx11::string::~string((string *)&location);
    FieldDescriptorProto::clear_json_name(field);
  }
  bVar1 = Consume(this,"json_name");
  if ((bVar1) && (bVar1 = Consume(this,"="), bVar1)) {
    LocationRecorder::LocationRecorder(&location,field_location,10);
    LocationRecorder::RecordLegacyLocation(&location,&field->super_Message,OPTION_VALUE);
    output = FieldDescriptorProto::mutable_json_name_abi_cxx11_(field);
    bVar1 = ConsumeString(this,output,"Expected string for JSON name.");
    LocationRecorder::~LocationRecorder(&location);
    return bVar1;
  }
  return false;
}

Assistant:

bool Parser::ParseJsonName(
    FieldDescriptorProto* field,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  if (field->has_json_name()) {
    AddError("Already set option \"json_name\".");
    field->clear_json_name();
  }

  DO(Consume("json_name"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kJsonNameFieldNumber);
  location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::OPTION_VALUE);
  DO(ConsumeString(field->mutable_json_name(),
                   "Expected string for JSON name."));
  return true;
}